

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomModel.pb.h
# Opt level: O3

size_t __thiscall
CoreML::Specification::CustomModel_CustomModelParamValue::ByteSizeLong
          (CustomModel_CustomModelParamValue *this)

{
  uint32 uVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  
  uVar1 = this->_oneof_case_[0];
  sVar6 = 0;
  if ((int)uVar1 < 0x28) {
    if (uVar1 == 10) {
      sVar6 = 9;
      goto LAB_002a0da3;
    }
    if (uVar1 != 0x14) {
      if (uVar1 == 0x1e) {
        if ((this->value_).intvalue_ < 0) {
          sVar6 = 0xc;
        }
        else {
          uVar4 = (this->value_).intvalue_ | 1;
          iVar3 = 0x1f;
          if (uVar4 != 0) {
            for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
            }
          }
          sVar6 = (size_t)((iVar3 * 9 + 0x49U >> 6) + 2);
        }
      }
      goto LAB_002a0da3;
    }
  }
  else {
    if (uVar1 == 0x28) {
      uVar5 = (this->value_).longvalue_ | 1;
      lVar2 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar6 = (ulong)((int)lVar2 * 9 + 0x49U >> 6) + 2;
      goto LAB_002a0da3;
    }
    if (uVar1 == 0x32) {
      sVar6 = 3;
      goto LAB_002a0da3;
    }
    if (uVar1 != 0x3c) goto LAB_002a0da3;
  }
  lVar2 = *(long *)((this->value_).longvalue_ + 8);
  uVar4 = (uint)lVar2 | 1;
  iVar3 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> iVar3 == 0; iVar3 = iVar3 + -1) {
    }
  }
  sVar6 = lVar2 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 2;
LAB_002a0da3:
  this->_cached_size_ = (int)sVar6;
  return sVar6;
}

Assistant:

inline CustomModel_CustomModelParamValue::ValueCase CustomModel_CustomModelParamValue::value_case() const {
  return CustomModel_CustomModelParamValue::ValueCase(_oneof_case_[0]);
}